

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

size_t hpa_ndirty_max(tsdn_t *tsdn,hpa_shard_t *shard)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)*(uint *)(tsdn[2].tsd.
                           cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
                           bin_refilled + 0xc);
  if (uVar2 == 0xffffffff) {
    return 0xffffffffffffffff;
  }
  uVar1 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins[0x14].tstats
          .nrequests;
  if (uVar1 >> 0x30 == 0) {
    return uVar1 * uVar2 >> 0x10;
  }
  return (uVar1 >> 0x10) * uVar2;
}

Assistant:

static size_t
hpa_ndirty_max(tsdn_t *tsdn, hpa_shard_t *shard) {
	malloc_mutex_assert_owner(tsdn, &shard->mtx);
	if (shard->opts.dirty_mult == (fxp_t)-1) {
		return (size_t)-1;
	}
	return fxp_mul_frac(psset_nactive(&shard->psset),
	    shard->opts.dirty_mult);
}